

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_2c0f7::ParseDummyNode::configureAttribute
          (ParseDummyNode *this,ConfigureContext *param_1,StringRef name,
          ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> values)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  string local_b8;
  string local_98;
  iterator local_78;
  pair<llvm::StringRef,_llvm::StringRef> *value;
  iterator __end3;
  iterator __begin3;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> *__range3;
  ConfigureContext *local_38;
  ConfigureContext *param_1_local;
  ParseDummyNode *this_local;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> values_local;
  StringRef name_local;
  
  values_local.Data = (pair<llvm::StringRef,_llvm::StringRef> *)values.Length;
  this_local = (ParseDummyNode *)values.Data;
  values_local.Length = (size_type)name.Data;
  local_38 = param_1;
  param_1_local = (ConfigureContext *)this;
  uVar1 = (*(this->delegate->super_BuildFileDelegate)._vptr_BuildFileDelegate[0xd])();
  if ((uVar1 & 1) != 0) {
    llvm::StringRef::str_abi_cxx11_((string *)&__range3,(StringRef *)&values_local.Length);
    uVar2 = std::__cxx11::string::c_str();
    printf("  -- \'%s\': {\n",uVar2);
    std::__cxx11::string::~string((string *)&__range3);
    __begin3 = (iterator)&this_local;
    __end3 = llvm::ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_>::begin
                       ((ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> *)__begin3);
    value = llvm::ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_>::end
                      ((ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> *)__begin3);
    for (; __end3 != value; __end3 = __end3 + 1) {
      local_78 = __end3;
      llvm::StringRef::str_abi_cxx11_(&local_98,&__end3->first);
      uVar2 = std::__cxx11::string::c_str();
      llvm::StringRef::str_abi_cxx11_(&local_b8,&local_78->second);
      uVar3 = std::__cxx11::string::c_str();
      printf("  --   \'%s\': \'%s\'\n",uVar2,uVar3);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_98);
    }
    printf("  -- }\n");
  }
  return true;
}

Assistant:

virtual bool configureAttribute(
      const ConfigureContext&, StringRef name,
      ArrayRef<std::pair<StringRef, StringRef>> values) override {
    if (delegate.shouldShowOutput()) {
      printf("  -- '%s': {\n", name.str().c_str());
      for (const auto& value: values) {
        printf("  --   '%s': '%s'\n", value.first.str().c_str(),
               value.second.str().c_str());
      }
      printf("  -- }\n");
    }
    return true;
  }